

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O3

base_uint<256UL,_void> * __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STBitString<256ul>,jbcoin::base_uint<256ul,void>>
          (base_uint<256UL,_void> *__return_storage_ptr__,STObject *this,SField *field)

{
  STBase *pSVar1;
  SField *pSVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  
  iVar3 = getFieldIndex(this,field);
  if (iVar3 != -1) {
    pSVar1 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar3].p_;
    if (pSVar1 != (STBase *)0x0) {
      iVar3 = (*pSVar1->_vptr_STBase[4])(pSVar1);
      if (iVar3 == 0) {
        uVar4 = 0;
        uVar5 = 0;
        uVar6 = 0;
        uVar7 = 0;
        __return_storage_ptr__->pn[4] = 0;
        __return_storage_ptr__->pn[5] = 0;
        __return_storage_ptr__->pn[6] = 0;
        __return_storage_ptr__->pn[7] = 0;
      }
      else {
        if (pSVar1->_vptr_STBase != (_func_int **)&PTR__STBase_002d4650) {
          Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
        }
        uVar4 = *(uint32_t *)&pSVar1[1]._vptr_STBase;
        uVar5 = *(uint32_t *)((long)&pSVar1[1]._vptr_STBase + 4);
        uVar6 = *(uint32_t *)&pSVar1[1].fName;
        uVar7 = *(uint32_t *)((long)&pSVar1[1].fName + 4);
        pSVar2 = pSVar1[2].fName;
        *(_func_int ***)(__return_storage_ptr__->pn + 4) = pSVar1[2]._vptr_STBase;
        *(SField **)(__return_storage_ptr__->pn + 6) = pSVar2;
      }
      __return_storage_ptr__->pn[0] = uVar4;
      __return_storage_ptr__->pn[1] = uVar5;
      __return_storage_ptr__->pn[2] = uVar6;
      __return_storage_ptr__->pn[3] = uVar7;
      return __return_storage_ptr__;
    }
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }